

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# View.cpp
# Opt level: O0

void __thiscall sf::View::View(View *this,FloatRect *rectangle)

{
  FloatRect *in_RSI;
  View *in_RDI;
  
  Vector2<float>::Vector2(&in_RDI->m_center);
  Vector2<float>::Vector2(&in_RDI->m_size);
  in_RDI->m_rotation = 0.0;
  Rect<float>::Rect(&in_RDI->m_viewport,0.0,0.0,1.0,1.0);
  Transform::Transform(&in_RDI->m_transform);
  Transform::Transform(&in_RDI->m_inverseTransform);
  in_RDI->m_transformUpdated = false;
  in_RDI->m_invTransformUpdated = false;
  reset(in_RDI,in_RSI);
  return;
}

Assistant:

View::View(const FloatRect& rectangle) :
m_center             (),
m_size               (),
m_rotation           (0),
m_viewport           (0, 0, 1, 1),
m_transformUpdated   (false),
m_invTransformUpdated(false)
{
    reset(rectangle);
}